

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

void __thiscall ByteCodeGenerator::ProcessCapturedSym(ByteCodeGenerator *this,Symbol *sym)

{
  FuncInfo *funcInfo;
  FuncInfo *this_00;
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  LocalFunctionId functionId;
  undefined4 *puVar3;
  ParseNodeFnc *pPVar4;
  
  funcInfo = sym->scope->func;
  this_00 = funcInfo->currentChildFunction;
  bVar2 = Symbol::NeedsSlotAlloc(sym,this,funcInfo);
  if ((!bVar2) && ((*(ushort *)&sym->field_0x42 & 0xc008) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0xc4c,
                       "(sym->NeedsSlotAlloc(this, funcHome) || sym->GetIsGlobal() || sym->GetIsModuleImport() || sym->GetIsModuleExportStorage())"
                       ,
                       "sym->NeedsSlotAlloc(this, funcHome) || sym->GetIsGlobal() || sym->GetIsModuleImport() || sym->GetIsModuleExportStorage()"
                      );
    if (!bVar2) goto LAB_0077bf85;
    *puVar3 = 0;
  }
  if (sym->scope->scopeType == ScopeType_FuncExpr) {
    if (funcInfo->paramScope == (Scope *)0x0) {
LAB_0077bdc7:
      if (((funcInfo->field_0xb5 & 0x80) != 0) && (funcInfo->bodyScope != (Scope *)0x0)) {
        bVar2 = Scope::HasSymbolName(funcInfo->bodyScope,&sym->name);
        if (bVar2) goto LAB_0077bde9;
      }
    }
    else {
      bVar2 = Scope::HasSymbolName(funcInfo->paramScope,&sym->name);
      if (!bVar2) goto LAB_0077bdc7;
LAB_0077bde9:
      Scope::SetIsObject(sym->scope);
    }
  }
  bVar2 = FuncInfo::IsGlobalFunction(funcInfo);
  if ((((bVar2) || ((*(uint *)&funcInfo->field_0xb4 & 2) != 0)) ||
      (this_00 == (FuncInfo *)0x0 || (char)((*(uint *)&funcInfo->field_0xb4 & 4) >> 2) != '\0')) ||
     (sym->scope != funcInfo->bodyScope)) {
LAB_0077be6a:
    sym->field_0x43 = sym->field_0x43 | 4;
  }
  else {
    bVar2 = IsInDebugMode(this);
    if (bVar2) goto LAB_0077be6a;
    sourceContextId =
         Js::FunctionProxy::GetSourceContextId(&funcInfo->byteCodeFunction->super_FunctionProxy);
    functionId = Js::FunctionProxy::GetLocalFunctionId
                           (&funcInfo->byteCodeFunction->super_FunctionProxy);
    bVar2 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01441eb0,DelayCapturePhase,sourceContextId,functionId);
    if (bVar2) goto LAB_0077be6a;
  }
  bVar2 = Symbol::GetIsCommittedToSlot(sym);
  if (!bVar2) {
    if (this_00 == (FuncInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0xc6b,"(funcChild)","funcChild");
      if (!bVar2) goto LAB_0077bf85;
      *puVar3 = 0;
    }
    pPVar4 = this_00->root;
    if ((pPVar4 == (ParseNodeFnc *)0x0) || ((pPVar4->super_ParseNode).nop != knopFncDecl)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0xc6e,"(pnodeChild && pnodeChild->nop == knopFncDecl)",
                         "pnodeChild && pnodeChild->nop == knopFncDecl");
      if (!bVar2) {
LAB_0077bf85:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    pPVar4 = ParseNode::AsParseNodeFnc(&pPVar4->super_ParseNode);
    if (((pPVar4->fncFlags & kFunctionDeclaration) == kFunctionNone) ||
       ((funcInfo->currentChildScope != sym->scope &&
        (funcInfo->currentChildScope->scopeType != ScopeType_FunctionBody)))) {
      FuncInfo::AddCapturedSym(this_00,sym);
      return;
    }
    sym->field_0x43 = sym->field_0x43 | 4;
  }
  return;
}

Assistant:

void ByteCodeGenerator::ProcessCapturedSym(Symbol *sym)
{
    // The symbol's home function will tell us which child function we're currently processing.
    // This is the one that captures the symbol, from the declaring function's perspective.
    // So based on that information, note either that, (a.) the symbol is committed to the heap from its
    // inception, (b.) the symbol must be committed when the capturing function is instantiated.

    FuncInfo *funcHome = sym->GetScope()->GetFunc();
    FuncInfo *funcChild = funcHome->GetCurrentChildFunction();

    Assert(sym->NeedsSlotAlloc(this, funcHome) || sym->GetIsGlobal() || sym->GetIsModuleImport() || sym->GetIsModuleExportStorage());

    if (sym->GetScope()->GetScopeType() == ScopeType_FuncExpr)
    {
        if ((funcHome->GetParamScope() && Scope::HasSymbolName(funcHome->GetParamScope(), sym->GetName())) ||
            (funcHome->IsBodyAndParamScopeMerged() && funcHome->GetBodyScope() && Scope::HasSymbolName(funcHome->GetBodyScope(), sym->GetName())))
        {
            // Make sure the function expression scope gets instantiated, since we can't merge the name symbol into another scope.
            // Make it an object, since that's the only case the code gen can currently handle.
            sym->GetScope()->SetIsObject();
        }
    }

    // If this is not a local property, or not all its references can be tracked, or
    // it's not scoped to the function, or we're in debug mode, disable the delayed capture optimization.
    if (funcHome->IsGlobalFunction() ||
        funcHome->GetCallsEval() ||
        funcHome->GetChildCallsEval() ||
        funcChild == nullptr ||
        sym->GetScope() != funcHome->GetBodyScope() ||
        this->IsInDebugMode() ||
        PHASE_OFF(Js::DelayCapturePhase, funcHome->byteCodeFunction))
    {
        sym->SetIsCommittedToSlot();
    }

    if (sym->GetIsCommittedToSlot())
    {
        return;
    }

    AnalysisAssert(funcChild);
    ParseNode *pnodeChild = funcChild->root;

    Assert(pnodeChild && pnodeChild->nop == knopFncDecl);

    if (pnodeChild->AsParseNodeFnc()->IsDeclaration())
    {
        // The capturing function is a declaration but may still be limited to an inner scope.
        Scope *scopeChild = funcHome->GetCurrentChildScope();
        if (scopeChild == sym->GetScope() || scopeChild->GetScopeType() == ScopeType_FunctionBody)
        {
            // The symbol is captured on entry to the scope in which it's declared.
            // (Check the scope type separately so that we get the special parameter list and
            // named function expression cases as well.)
            sym->SetIsCommittedToSlot();
            return;
        }
    }

    // There is a chance we can limit the region in which the symbol lives on the heap.
    // Note which function captures the symbol.
    funcChild->AddCapturedSym(sym);
}